

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O3

void __thiscall dynamicgraph::Signal<int,_int>::Signal(Signal<int,_int> *this,string *name)

{
  pointer pcVar1;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + name->_M_string_length);
  (this->super_SignalBase<int>)._vptr_SignalBase = (_func_int **)&PTR__SignalBase_00134888;
  (this->super_SignalBase<int>).name._M_dataplus._M_p =
       (pointer)&(this->super_SignalBase<int>).name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_SignalBase<int>).name,local_38,local_30 + (long)local_38);
  (this->super_SignalBase<int>).signalTime = 0;
  (this->super_SignalBase<int>).ready = false;
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  (this->super_SignalBase<int>)._vptr_SignalBase = (_func_int **)&PTR__Signal_00135210;
  this->signalType = CONSTANT;
  this->Tcopy1 = 0;
  this->Tcopy2 = 0;
  this->Tcopy = &this->Tcopy1;
  this->providerMutex = (Mutex *)0x0;
  this->Treference = (int *)0x0;
  this->TreferenceNonConst = (int *)0x0;
  (this->Tfunction).super_function_base.vtable = (vtable_base *)0x0;
  *(undefined8 *)&(this->Tfunction).super_function_base.functor = 0;
  *(undefined8 *)((long)&(this->Tfunction).super_function_base.functor + 8) = 0;
  *(undefined8 *)((long)&(this->Tfunction).super_function_base.functor + 0x10) = 0;
  this->keepReference = false;
  return;
}

Assistant:

Signal<T, Time>::Signal(std::string name)
    : __SIGNAL_INIT(name, T(), NULL, NULL, NULL) {
  return;
}